

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.hpp
# Opt level: O2

void __thiscall front::symbol::VoidSymbol::~VoidSymbol(VoidSymbol *this)

{
  Symbol::~Symbol(&this->super_Symbol);
  operator_delete(this,0x30);
  return;
}

Assistant:

virtual ~VoidSymbol() {}